

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O3

void __thiscall
QList<QXmlStreamEntityDeclaration>::resize(QList<QXmlStreamEntityDeclaration> *this,qsizetype size)

{
  Data *pDVar1;
  long lVar2;
  QXmlStreamEntityDeclaration *pQVar3;
  
  pDVar1 = (this->d).d;
  if (((pDVar1 == (Data *)0x0) ||
      (1 < (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) ||
     (pQVar3 = (this->d).ptr,
     ((long)((long)pQVar3 -
            ((ulong)((long)&pDVar1[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 3) *
     0x1111111111111111 + (pDVar1->super_QArrayData).alloc < size)) {
    QArrayDataPointer<QXmlStreamEntityDeclaration>::detachAndGrow
              (&this->d,GrowsAtEnd,size - (this->d).size,(QXmlStreamEntityDeclaration **)0x0,
               (QArrayDataPointer<QXmlStreamEntityDeclaration> *)0x0);
    lVar2 = (this->d).size;
  }
  else {
    lVar2 = (this->d).size;
    if (size < lVar2) {
      pQVar3 = pQVar3 + size;
      lVar2 = lVar2 * 0x78 + size * -0x78;
      do {
        QXmlStreamEntityDeclaration::~QXmlStreamEntityDeclaration(pQVar3);
        pQVar3 = pQVar3 + 1;
        lVar2 = lVar2 + -0x78;
      } while (lVar2 != 0);
      goto LAB_0039c188;
    }
  }
  if (size <= lVar2) {
    return;
  }
  pQVar3 = (this->d).ptr;
  std::__uninitialized_default_1<false>::__uninit_default<QXmlStreamEntityDeclaration*>
            (pQVar3 + lVar2,pQVar3 + size);
LAB_0039c188:
  (this->d).size = size;
  return;
}

Assistant:

void resize(qsizetype size)
    {
        resize_internal(size);
        if (size > this->size())
            d->appendInitialize(size);
    }